

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

vector<CNetAddr,_std::allocator<CNetAddr>_> *
LookupHost(vector<CNetAddr,_std::allocator<CNetAddr>_> *__return_storage_ptr__,string *name,
          uint nMaxSolutions,bool fAllowLookup,DNSLookupFn dns_lookup_function)

{
  char *pcVar1;
  char *pcVar2;
  size_type sVar3;
  size_type sVar4;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_R8;
  long in_FS_OFFSET;
  bool bVar5;
  string strHost;
  _Any_data _Stack_98;
  code *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (name->_M_dataplus)._M_p;
  sVar3 = name->_M_string_length;
  bVar5 = sVar3 == 0;
  if ((!bVar5) && (*pcVar2 != '\0')) {
    sVar4 = 1;
    do {
      bVar5 = sVar3 == sVar4;
      if (bVar5) break;
      pcVar1 = pcVar2 + sVar4;
      sVar4 = sVar4 + 1;
    } while (*pcVar1 != '\0');
  }
  if (bVar5) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar2,pcVar2 + sVar3);
    if (local_58._M_string_length == 0) {
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      if ((*local_58._M_dataplus._M_p == '[') &&
         (local_58._M_dataplus._M_p[local_58._M_string_length - 1] == ']')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_78,&local_58,1,local_58._M_string_length - 2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)&_Stack_98,in_R8);
      LookupIntern(__return_storage_ptr__,&local_58,nMaxSolutions,fAllowLookup,
                   (DNSLookupFn *)&_Stack_98);
      if (local_88 != (code *)0x0) {
        (*local_88)(&_Stack_98,&_Stack_98,__destroy_functor);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_006ad7f7:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006ad7f7;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CNetAddr> LookupHost(const std::string& name, unsigned int nMaxSolutions, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) return {};
    std::string strHost = name;
    if (strHost.empty()) return {};
    if (strHost.front() == '[' && strHost.back() == ']') {
        strHost = strHost.substr(1, strHost.size() - 2);
    }

    return LookupIntern(strHost, nMaxSolutions, fAllowLookup, dns_lookup_function);
}